

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseRenderingCase::BaseRenderingCase
          (BaseRenderingCase *this,Context *context,char *name,char *desc,RenderTarget target,
          int numSamples,int renderSize)

{
  RenderTarget *pRVar1;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  TextureFormat local_30;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_02139bb0;
  this->m_renderSize = renderSize;
  this->m_numSamples = -1;
  this->m_subpixelBits = -1;
  this->m_flatshade = false;
  this->m_numRequestedSamples = numSamples;
  this->m_renderTarget = target;
  this->m_fboInternalFormat = 0x8058;
  if (target == RENDERTARGET_DEFAULT) {
    pRVar1 = Context::getRenderTarget(context);
    local_48 = (pRVar1->m_pixelFormat).redBits;
    iStack_44 = (pRVar1->m_pixelFormat).greenBits;
    iStack_40 = (pRVar1->m_pixelFormat).blueBits;
    iStack_3c = (pRVar1->m_pixelFormat).alphaBits;
  }
  else {
    local_30 = glu::mapGLInternalFormat(0x8058);
    tcu::getTextureFormatBitDepth((tcu *)&local_48,&local_30);
  }
  (this->m_pixelFormat).redBits = local_48;
  (this->m_pixelFormat).greenBits = iStack_44;
  (this->m_pixelFormat).blueBits = iStack_40;
  (this->m_pixelFormat).alphaBits = iStack_3c;
  this->m_texture = 0;
  this->m_rbo = 0;
  this->m_blitDstFbo = 0;
  this->m_blitDstRbo = 0;
  this->m_shader = (ShaderProgram *)0x0;
  this->m_fbo = 0;
  this->m_texture = 0;
  return;
}

Assistant:

BaseRenderingCase::BaseRenderingCase (Context& context, const char* name, const char* desc, RenderTarget target, int numSamples, int renderSize)
	: TestCase				(context, name, desc)
	, m_renderSize			(renderSize)
	, m_numSamples			(-1)
	, m_subpixelBits		(-1)
	, m_flatshade			(false)
	, m_numRequestedSamples	(numSamples)
	, m_renderTarget		(target)
	, m_fboInternalFormat	(GL_RGBA8)
	, m_pixelFormat			((m_renderTarget == RENDERTARGET_DEFAULT) ? (m_context.getRenderTarget().getPixelFormat()) : (getInternalFormatPixelFormat(m_fboInternalFormat)))
	, m_shader				(DE_NULL)
	, m_fbo					(0)
	, m_texture				(0)
	, m_rbo					(0)
	, m_blitDstFbo			(0)
	, m_blitDstRbo			(0)
{
	DE_ASSERT(m_renderTarget < RENDERTARGET_LAST);
	DE_ASSERT((m_numRequestedSamples == -1) == (m_renderTarget != RENDERTARGET_RBO_MULTISAMPLE));
}